

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O2

String * doctest::toString<long_double>(IsNaN<long_double> in)

{
  char *in_00;
  String *in_RDI;
  longdouble in_stack_00000008;
  char in_stack_00000018;
  String local_98;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  String local_20;
  
  in_00 = "";
  if (in_stack_00000018 != '\0') {
    in_00 = "! ";
  }
  String::String(&local_50,in_00);
  String::String(&local_68,"IsNaN( ");
  operator+(&local_38,&local_50,&local_68);
  detail::toStreamLit<long_double>(&local_80,in_stack_00000008);
  operator+(&local_20,&local_38,&local_80);
  String::String(&local_98," )");
  operator+(in_RDI,&local_20,&local_98);
  String::~String(&local_98);
  String::~String(&local_20);
  String::~String(&local_80);
  String::~String(&local_38);
  String::~String(&local_68);
  String::~String(&local_50);
  return in_RDI;
}

Assistant:

String toString(IsNaN<F> in) { return String(in.flipped ? "! " : "") + "IsNaN( " + doctest::toString(in.value) + " )"; }